

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_unshuffle_8bytes(char *heap,LONGLONG length,int *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int extraout_EAX;
  void *__src;
  long lVar4;
  long lVar5;
  long lVar6;
  
  __src = malloc(length * 8);
  lVar4 = -length;
  lVar5 = 0;
  lVar6 = 0;
  if (0 < length) {
    lVar6 = length;
  }
  lVar1 = length * 8 + -1;
  for (; -lVar5 != lVar6; lVar5 = lVar5 + -1) {
    lVar2 = lVar5 + lVar1;
    *(char *)((long)__src + lVar5 * 8 + length * 8 + -1) = heap[lVar5 + lVar1];
    lVar3 = lVar4 + lVar2;
    *(char *)((long)__src + lVar5 * 8 + length * 8 + -2) = heap[lVar4 + lVar2];
    lVar2 = lVar4 + lVar3;
    *(char *)((long)__src + lVar5 * 8 + length * 8 + -3) = heap[lVar4 + lVar3];
    lVar3 = lVar4 + lVar2;
    *(char *)((long)__src + lVar5 * 8 + length * 8 + -4) = heap[lVar4 + lVar2];
    lVar2 = lVar4 + lVar3;
    *(char *)((long)__src + lVar5 * 8 + length * 8 + -5) = heap[lVar4 + lVar3];
    lVar3 = lVar4 + lVar2;
    *(char *)((long)__src + lVar5 * 8 + length * 8 + -6) = heap[lVar4 + lVar2];
    *(char *)((long)__src + lVar5 * 8 + length * 8 + -7) = heap[lVar4 + lVar3];
    *(char *)((long)__src + lVar5 * 8 + length * 8 + -8) = heap[length * -2 + lVar3];
  }
  memcpy(heap,__src,length * 8);
  free(__src);
  return extraout_EAX;
}

Assistant:

static int fits_unshuffle_8bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 8-byte integers or doubles */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 8));
    heapptr = heap + (8 * length) - 1;
    cptr = ptr + (8 * length)  -1;
    
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       *cptr = *(heapptr - (2 * length));
       cptr--;
       *cptr = *(heapptr - (3 * length));
       cptr--;
       *cptr = *(heapptr - (4 * length));
       cptr--;
       *cptr = *(heapptr - (5 * length));
       cptr--;
       *cptr = *(heapptr - (6 * length));
       cptr--;
       *cptr = *(heapptr - (7 * length));
       cptr--;
       heapptr--;
    }
       
    memcpy(heap, ptr, (size_t) (length * 8));
    free(ptr);
    return(*status);
}